

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mocker::ir::Interpreter::initExternalFuncs(Interpreter *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>_>
  *this_00;
  pointer p_Var1;
  size_t sVar2;
  __node_ptr p_Var3;
  ulong uVar4;
  _Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  *p_Var5;
  allocator<char> local_41;
  _Scoped_node local_40;
  
  this_00 = &this->externalFuncs;
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#_array_#_ctor_",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:295:25)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:295:25)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#_array_#size",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:297:42)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:297:42)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#length",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:303:43)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:303:43)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#add",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:308:40)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:308:40)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#substring",&local_41)
  ;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:323:46)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:323:46)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#ord",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:334:40)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:334:40)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#parseInt",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:338:45)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:338:45)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"#string#_ctor_",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:345:25)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:345:25)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"getInt",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:348:35)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:348:35)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"print",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:354:34)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:354:34)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"println",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:361:36)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:361:36)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"_printInt",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:367:38)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:367:38)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"_printlnInt",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:371:40)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:371:40)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"getString",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:376:38)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:376:38)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"toString",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(Interpreter **)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:387:37)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:387:37)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  local_40._M_h = (__hashtable_alloc *)this_00;
  p_Var1 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var1->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var5 = &p_Var1->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)p_Var5,"memcpy",&local_41);
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:398:35)>
       ::_M_invoke;
  *(code **)((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:398:35)>
       ::_M_manager;
  local_40._M_node = p_Var1;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var5);
  uVar4 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar4,(key_type *)p_Var5,sVar2);
  if (p_Var3 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar4,sVar2,p_Var1,1);
    local_40._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_40);
  return;
}

Assistant:

void Interpreter::initExternalFuncs() {
  using Args = const std::vector<std::int64_t> &;

  // #_array_#_ctor_ ( this arraySize elementSize )
  externalFuncs.emplace("#_array_#_ctor_",
                        [this](Args args) -> std::int64_t { assert(false); });
  // #_array_#size ( this )
  externalFuncs.emplace("#_array_#size", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });

  // #string#length ( this )
  externalFuncs.emplace("#string#length", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });
  // #string#add ( lhs rhs )
  externalFuncs.emplace("#string#add", [this](Args args) {
    auto lhsLen = externalFuncs["#string#length"]({args[0]});
    auto rhsLen = externalFuncs["#string#length"]({args[1]});
    std::int64_t length = lhsLen + rhsLen;

    char *resInstPtr = (char *)fastMalloc(length + 8);
    *(std::int64_t *)resInstPtr = length;
    resInstPtr += 8;

    std::memcpy(resInstPtr, (void *)args[0], (std::size_t)lhsLen);
    std::memcpy((char *)resInstPtr + lhsLen, (void *)args[1],
                (std::size_t)rhsLen);
    return (std::int64_t)resInstPtr;
  });
  // #string#substring ( this left right )
  externalFuncs.emplace("#string#substring", [this](Args args) {
    auto len = args[2] - args[1];
    char *resInstPtr = (char *)fastMalloc(len + 8);
    *(std::int64_t *)(resInstPtr) = len;
    resInstPtr += 8;

    auto srcContentPtr = (char *)args[0] + args[1];
    std::memcpy(resInstPtr, srcContentPtr, (std::size_t)len);
    return (std::int64_t)resInstPtr;
  });
  // #string#ord ( this pos )
  externalFuncs.emplace("#string#ord", [](Args args) {
    return (std::int64_t) * ((char *)args[0] + args[1]);
  });
  // #string#parseInt ( this )
  externalFuncs.emplace("#string#parseInt", [](Args args) {
    auto len = *((std::int64_t *)args[0] - 1);
    std::string str{(char *)args[0], (char *)args[0] + len};
    return std::stoll(str);
  });
  // #string#_ctor_ ( this )
  externalFuncs.emplace("#string#_ctor_",
                        [](Args args) -> std::int64_t { assert(false); });

  // getInt (  )
  externalFuncs.emplace("getInt", [](Args args) {
    std::int64_t res;
    std::cin >> res;
    return res;
  });
  // print ( str )
  externalFuncs.emplace("print", [this](Args args) {
    auto len = externalFuncs["#string#length"]({args[0]});
    auto str = std::string{(char *)args[0], (char *)args[0] + len};
    std::cout << str;
    return 0;
  });
  // println ( str )
  externalFuncs.emplace("println", [this](Args args) {
    externalFuncs["print"]({args[0]});
    std::cout << std::endl;
    return 0;
  });
  // _printInt ( x )
  externalFuncs.emplace("_printInt", [this](Args args) {
    std::cout << args[0];
    return 0;
  });
  externalFuncs.emplace("_printlnInt", [this](Args args) {
    std::cout << args[0] << std::endl;
    return 0;
  });
  // getString (  )
  externalFuncs.emplace("getString", [this](Args args) {
    std::string str;
    std::cin >> str;

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });
  // toString ( i )
  externalFuncs.emplace("toString", [this](Args args) {
    auto str = std::to_string(args[0]);

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });

  // memcpy ( dest src count )
  externalFuncs.emplace("memcpy", [](Args args) {
    std::memcpy((void *)args[0], (void *)args[1], (std::size_t)args[2]);
    return 0;
  });
}